

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitRethrow(FunctionValidator *this,Rethrow *curr)

{
  shouldBeTrue<wasm::Rethrow*>
            (this,SUB41(((((this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule)->features).features & 0x40) >> 6,0),curr,
             "rethrow requires exception-handling [--enable-exception-handling]");
  shouldBeEqual<wasm::Rethrow*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)51>).super_Expression.
                        type.id,(Type)0x1,curr,"rethrow\'s type must be unreachable");
  noteRethrow(this,(Name)(curr->target).super_IString.str,(Expression *)curr);
  return;
}

Assistant:

void FunctionValidator::visitRethrow(Rethrow* curr) {
  shouldBeTrue(
    getModule()->features.hasExceptionHandling(),
    curr,
    "rethrow requires exception-handling [--enable-exception-handling]");
  shouldBeEqual(curr->type,
                Type(Type::unreachable),
                curr,
                "rethrow's type must be unreachable");
  noteRethrow(curr->target, curr);
}